

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

bool vkt::Draw::anon_unknown_0::imageCompare
               (TestLog *log,ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
               VkPrimitiveTopology topology)

{
  Vector<int,_3> local_48;
  Vector<unsigned_int,_4> local_3c;
  VkPrimitiveTopology local_2c;
  ConstPixelBufferAccess *pCStack_28;
  VkPrimitiveTopology topology_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  TestLog *log_local;
  
  local_2c = topology;
  pCStack_28 = result;
  result_local = reference;
  reference_local = (ConstPixelBufferAccess *)log;
  if (topology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    tcu::Vector<unsigned_int,_4>::Vector(&local_3c,4);
    tcu::Vector<int,_3>::Vector(&local_48,1,1,0);
    log_local._7_1_ =
         tcu::intThresholdPositionDeviationCompare
                   (log,"Result","Image comparison result",reference,result,&local_3c,&local_48,true
                    ,COMPARE_LOG_RESULT);
  }
  else {
    log_local._7_1_ =
         tcu::fuzzyCompare(log,"Result","Image comparison result",reference,result,0.05,
                           COMPARE_LOG_RESULT);
  }
  return log_local._7_1_;
}

Assistant:

inline bool imageCompare (tcu::TestLog& log, const tcu::ConstPixelBufferAccess& reference, const tcu::ConstPixelBufferAccess& result, const vk::VkPrimitiveTopology topology)
{
	if (topology == vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
	{
		return tcu::intThresholdPositionDeviationCompare(
			log, "Result", "Image comparison result", reference, result,
			tcu::UVec4(4u),					// color threshold
			tcu::IVec3(1, 1, 0),			// position deviation tolerance
			true,							// don't check the pixels at the boundary
			tcu::COMPARE_LOG_RESULT);
	}
	else
		return tcu::fuzzyCompare(log, "Result", "Image comparison result", reference, result, 0.05f, tcu::COMPARE_LOG_RESULT);
}